

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Shrink(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_44;
  uint local_40;
  int nFanoutMax;
  int fKeepLevel;
  int fVerbose;
  int c;
  int nLutSize;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  _c = (Gia_Man_t *)0x0;
  nFanoutMax = 0;
  local_40 = 0;
  local_44 = 0x32;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Nlvh");
      if (iVar1 == -1) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Shrink(): There is no AIG.\n");
          return 1;
        }
        iVar1 = Gia_ManHasMapping(pAbc->pGia);
        if (iVar1 == 0) {
          Abc_Print(-1,"Abc_CommandAbc9Shrink(): Mapping of the AIG is not defined.\n");
          return 1;
        }
        iVar1 = Gia_ManLutSizeMax(pAbc->pGia);
        if (iVar1 < 5) {
          _c = Gia_ManMapShrink4(pAbc->pGia,local_40,nFanoutMax);
        }
        else if (iVar1 < 7) {
          _c = Gia_ManMapShrink6(pAbc->pGia,local_44,local_40,nFanoutMax);
        }
        else {
          Abc_Print(-1,"Abc_CommandAbc9Shrink(): Works only for 4-LUTs and 6-LUTs.\n");
        }
        if (_c != (Gia_Man_t *)0x0) {
          Abc_FrameUpdateGia(pAbc,_c);
        }
        return 0;
      }
      if (iVar1 == 0x4e) break;
      if (iVar1 == 0x68) goto LAB_0024ddac;
      if (iVar1 == 0x6c) {
        local_40 = local_40 ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto LAB_0024ddac;
        nFanoutMax = nFanoutMax ^ 1;
      }
    }
    if (argc <= globalUtilOptind) break;
    local_44 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)local_44 < 0) {
LAB_0024ddac:
      Abc_Print(-2,"usage: &shrink [-N num] [-lvh]\n");
      Abc_Print(-2,"\t         performs fast shrinking using current mapping\n");
      Abc_Print(-2,"\t-N num : the max fanout count to skip a divisor [default = %d]\n",
                (ulong)local_44);
      pcVar2 = "no";
      if (local_40 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-l     : toggle level update during shrinking [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (nFanoutMax != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by a char string.\n");
  goto LAB_0024ddac;
}

Assistant:

int Abc_CommandAbc9Shrink( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp = NULL;
    int nLutSize;
    int c,fVerbose = 0;
    int fKeepLevel = 0;
    int nFanoutMax = 50;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nlvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a char string.\n" );
                goto usage;
            }
            nFanoutMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFanoutMax < 0 )
                goto usage;
            break;
        case 'l':
            fKeepLevel ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Shrink(): There is no AIG.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Shrink(): Mapping of the AIG is not defined.\n" );
        return 1;
    }
    nLutSize = Gia_ManLutSizeMax( pAbc->pGia );
    if ( nLutSize <= 4 )
        pTemp = Gia_ManMapShrink4( pAbc->pGia, fKeepLevel, fVerbose );
    else if ( nLutSize <= 6 )
        pTemp = Gia_ManMapShrink6( pAbc->pGia, nFanoutMax, fKeepLevel, fVerbose );
    else
        Abc_Print( -1, "Abc_CommandAbc9Shrink(): Works only for 4-LUTs and 6-LUTs.\n" );
    if ( pTemp )
        Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &shrink [-N num] [-lvh]\n" );
    Abc_Print( -2, "\t         performs fast shrinking using current mapping\n" );
    Abc_Print( -2, "\t-N num : the max fanout count to skip a divisor [default = %d]\n", nFanoutMax );
    Abc_Print( -2, "\t-l     : toggle level update during shrinking [default = %s]\n", fKeepLevel? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}